

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-lore.c
# Opt level: O2

_Bool lore_is_fully_known(monster_race *race)

{
  _Bool *p_Var1;
  long lVar2;
  long lVar3;
  monster_lore *lore;
  long lVar4;
  ulong uVar5;
  
  lore = get_lore(race);
  if (lore->all_known != false) {
    return true;
  }
  if (((lore->armour_known == true) &&
      (((lore->spell_freq_known != false || (race->freq_innate + race->freq_spell == 0)) &&
       (lore->drop_known == true)))) && (lore->sleep_known == true)) {
    lVar4 = 8;
    uVar5 = 0;
    while ((z_info->mon_blows_max != uVar5 && (*(long *)((long)&race->blow->next + lVar4) != 0))) {
      lVar4 = lVar4 + 0x30;
      p_Var1 = lore->blow_known + uVar5;
      uVar5 = uVar5 + 1;
      if (*p_Var1 == false) {
        return false;
      }
    }
    lVar4 = 0x20;
    do {
      if (lVar4 == 0x2c) {
        lVar4 = 0x68;
        do {
          if (lVar4 == 0x75) {
            lore->all_known = true;
            lore_update(race,lore);
            return true;
          }
          lVar2 = lVar4 + -0x5c;
          lVar3 = lVar4 + -0x5c;
          lVar4 = lVar4 + 1;
        } while (lore->flags[lVar2] == race->flags[lVar3]);
        return false;
      }
      lVar2 = lVar4 + -0x20;
      lVar4 = lVar4 + 1;
    } while (lore->flags[lVar2] != '\0');
    return false;
  }
  return false;
}

Assistant:

bool lore_is_fully_known(const struct monster_race *race)
{
	unsigned i;
	struct monster_lore *lore = get_lore(race);

	/* Check if already known */
	if (lore->all_known)
		return true;
		
	if (!lore->armour_known)
		return false;
	/* Only check spells if the monster can cast them */
	if (!lore->spell_freq_known && race->freq_innate + race->freq_spell)
		return false;
	if (!lore->drop_known)
		return false;
	if (!lore->sleep_known)
		return false;
		
	/* Check if blows are known */
	for (i = 0; i < z_info->mon_blows_max; i++){
		/* Only check if the blow exists */
		if (!race->blow[i].method)
			break;
		if (!lore->blow_known[i])
			return false;
		
	}
		
	/* Check all the flags */
	for (i = 0; i < RF_SIZE; i++)
		if (!lore->flags[i])
			return false;
		
		
	/* Check spell flags */
	for (i = 0; i < RSF_SIZE; i++)
		if (lore->spell_flags[i] != race->spell_flags[i])			
			return false;
	
	/* The player knows everything */
	lore->all_known = true;
	lore_update(race, lore);
	return true;
}